

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QPodArrayOps<QLocale::Country>::emplace<QLocale::Country&>
          (QPodArrayOps<QLocale::Country> *this,qsizetype i,Country *args)

{
  Country CVar1;
  Data *pDVar2;
  long lVar3;
  Country *pCVar4;
  GrowthPosition where;
  
  pDVar2 = (this->super_QArrayDataPointer<QLocale::Country>).d;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_00322f37:
    CVar1 = *args;
    where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QLocale::Country>).size != 0);
    QArrayDataPointer<QLocale::Country>::detachAndGrow
              (&this->super_QArrayDataPointer<QLocale::Country>,where,1,(Country **)0x0,
               (QArrayDataPointer<QLocale::Country> *)0x0);
    pCVar4 = createHole(this,where,i,1);
    *pCVar4 = CVar1;
  }
  else {
    lVar3 = (this->super_QArrayDataPointer<QLocale::Country>).size;
    if ((lVar3 == i && pDVar2 != (Data *)0x0) &&
       ((pDVar2->super_QArrayData).alloc !=
        ((long)((long)(this->super_QArrayDataPointer<QLocale::Country>).ptr -
               ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1) +
        lVar3)) {
      (this->super_QArrayDataPointer<QLocale::Country>).ptr[lVar3] = *args;
    }
    else {
      if (((i != 0) || (pDVar2 == (Data *)0x0)) ||
         ((Country *)((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QArrayDataPointer<QLocale::Country>).ptr)) goto LAB_00322f37;
      pCVar4 = (this->super_QArrayDataPointer<QLocale::Country>).ptr;
      pCVar4[-1] = *args;
      (this->super_QArrayDataPointer<QLocale::Country>).ptr = pCVar4 + -1;
    }
    (this->super_QArrayDataPointer<QLocale::Country>).size = lVar3 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }